

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::has_default_value(FieldGeneratorBase *this)

{
  Type TVar1;
  uint32 uVar2;
  int32 iVar3;
  uint64 uVar4;
  int64 iVar5;
  LogMessage *other;
  float fVar6;
  double dVar7;
  LogFinisher local_5d [13];
  LogMessage local_50;
  FieldGeneratorBase *local_18;
  FieldGeneratorBase *this_local;
  
  local_18 = this;
  TVar1 = FieldDescriptor::type(this->descriptor_);
  switch(TVar1) {
  case TYPE_DOUBLE:
    dVar7 = FieldDescriptor::default_value_double(this->descriptor_);
    this_local._7_1_ = dVar7 != 0.0;
    break;
  case TYPE_FLOAT:
    fVar6 = FieldDescriptor::default_value_float(this->descriptor_);
    this_local._7_1_ = fVar6 != 0.0;
    break;
  case TYPE_INT64:
    iVar5 = FieldDescriptor::default_value_int64(this->descriptor_);
    this_local._7_1_ = iVar5 != 0;
    break;
  case TYPE_UINT64:
    uVar4 = FieldDescriptor::default_value_uint64(this->descriptor_);
    this_local._7_1_ = uVar4 != 0;
    break;
  case TYPE_INT32:
    iVar3 = FieldDescriptor::default_value_int32(this->descriptor_);
    this_local._7_1_ = iVar3 != 0;
    break;
  case TYPE_FIXED64:
    uVar4 = FieldDescriptor::default_value_uint64(this->descriptor_);
    this_local._7_1_ = uVar4 != 0;
    break;
  case TYPE_FIXED32:
    uVar2 = FieldDescriptor::default_value_uint32(this->descriptor_);
    this_local._7_1_ = uVar2 != 0;
    break;
  case TYPE_BOOL:
    this_local._7_1_ = FieldDescriptor::default_value_bool(this->descriptor_);
    break;
  case TYPE_STRING:
    this_local._7_1_ = true;
    break;
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_ENUM:
    this_local._7_1_ = true;
    break;
  case TYPE_BYTES:
    this_local._7_1_ = true;
    break;
  case TYPE_UINT32:
    uVar2 = FieldDescriptor::default_value_uint32(this->descriptor_);
    this_local._7_1_ = uVar2 != 0;
    break;
  case TYPE_SFIXED32:
    iVar3 = FieldDescriptor::default_value_int32(this->descriptor_);
    this_local._7_1_ = iVar3 != 0;
    break;
  case TYPE_SFIXED64:
    iVar5 = FieldDescriptor::default_value_int64(this->descriptor_);
    this_local._7_1_ = iVar5 != 0;
    break;
  case TYPE_SINT32:
    iVar3 = FieldDescriptor::default_value_int32(this->descriptor_);
    this_local._7_1_ = iVar3 != 0;
    break;
  case MAX_TYPE:
    iVar5 = FieldDescriptor::default_value_int64(this->descriptor_);
    this_local._7_1_ = iVar5 != 0;
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/csharp/csharp_field_base.cc"
               ,0xfb);
    other = internal::LogMessage::operator<<(&local_50,"Unknown field type.");
    internal::LogFinisher::operator=(local_5d,other);
    internal::LogMessage::~LogMessage(&local_50);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FieldGeneratorBase::has_default_value() {
  switch (descriptor_->type()) {
    case FieldDescriptor::TYPE_ENUM:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_GROUP:
      return true;
    case FieldDescriptor::TYPE_DOUBLE:
      return descriptor_->default_value_double() != 0.0;
    case FieldDescriptor::TYPE_FLOAT:
      return descriptor_->default_value_float() != 0.0;
    case FieldDescriptor::TYPE_INT64:
      return descriptor_->default_value_int64() != 0L;
    case FieldDescriptor::TYPE_UINT64:
      return descriptor_->default_value_uint64() != 0L;
    case FieldDescriptor::TYPE_INT32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_FIXED64:
      return descriptor_->default_value_uint64() != 0L;
    case FieldDescriptor::TYPE_FIXED32:
      return descriptor_->default_value_uint32() != 0;
    case FieldDescriptor::TYPE_BOOL:
      return descriptor_->default_value_bool();
    case FieldDescriptor::TYPE_STRING:
      return true;
    case FieldDescriptor::TYPE_BYTES:
      return true;
    case FieldDescriptor::TYPE_UINT32:
      return descriptor_->default_value_uint32() != 0;
    case FieldDescriptor::TYPE_SFIXED32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_SFIXED64:
      return descriptor_->default_value_int64() != 0L;
    case FieldDescriptor::TYPE_SINT32:
      return descriptor_->default_value_int32() != 0;
    case FieldDescriptor::TYPE_SINT64:
      return descriptor_->default_value_int64() != 0L;
    default:
      GOOGLE_LOG(FATAL)<< "Unknown field type.";
      return true;
  }
}